

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O2

bool __thiscall Rml::Element::IsVisible(Element *this,bool include_ancestors)

{
  undefined3 in_register_00000031;
  bool bVar1;
  
  if (CONCAT31(in_register_00000031,include_ancestors) == 0) {
    bVar1 = this->visible;
  }
  else {
    for (; (bVar1 = this == (Element *)0x0, !bVar1 && (this->visible == true)); this = this->parent)
    {
    }
  }
  return bVar1;
}

Assistant:

bool Element::IsVisible(bool include_ancestors) const
{
	if (!include_ancestors)
		return visible;
	const Element* element = this;
	while (element)
	{
		if (!element->visible)
			return false;
		element = element->parent;
	}
	return true;
}